

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  int iVar2;
  int elemNdx;
  int iVar3;
  VariableType *pVVar4;
  float fVar5;
  float fVar6;
  ConstValueRangeAccess local_58;
  ConstValueRangeAccess local_40;
  
  pVVar4 = valueRange.m_type;
  fVar5 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar3 = state->m_shaderParams->maxExpressionDepth;
    iVar1 = state->m_expressionDepth;
    iVar2 = getConservativeValueExprDepth(state,valueRange);
    fVar5 = 0.0;
    if (iVar2 + 1 <= iVar3 - iVar1) {
      fVar5 = 1.0;
      for (iVar3 = 0; iVar3 < pVVar4->m_numElements; iVar3 = iVar3 + 1) {
        ConstValueRangeAccess::component(&local_40,&valueRange,iVar3);
        fVar6 = (local_40.m_min)->floatVal;
        ConstValueRangeAccess::component(&local_58,&valueRange,iVar3);
        fVar6 = UnaryTrigonometricFunc<rsg::AsinOp>::getCompWeight(fVar6,(local_58.m_max)->floatVal)
        ;
        fVar5 = fVar5 * fVar6;
        pVVar4 = valueRange.m_type;
      }
    }
  }
  return fVar5;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}